

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Error __thiscall wave::File::Impl::ReadHeader(Impl *this,HeaderList *headers)

{
  uint16_t uVar1;
  bool bVar2;
  ulong uVar3;
  uint64_t uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  allocator local_1b9;
  undefined1 local_1b8 [4];
  uint16_t bps;
  allocator local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined4 local_148;
  allocator local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  undefined1 local_100 [8];
  Header data_header;
  Header local_a0;
  Header local_60;
  undefined8 local_30;
  pos_type file_size;
  HeaderList *headers_local;
  Impl *this_local;
  
  file_size._M_state = (__mbstate_t)headers;
  uVar3 = std::ifstream::is_open();
  if ((uVar3 & 1) == 0) {
    this_local._4_4_ = kNotOpen;
  }
  else {
    std::istream::seekg((long)this,_S_beg);
    auVar6 = std::istream::tellg();
    file_size._M_off = auVar6._8_8_;
    local_30 = auVar6._0_8_;
    uVar3 = std::fpos::operator_cast_to_long((fpos *)&local_30);
    if (uVar3 < 0x2c) {
      this_local._4_4_ = kInvalidFormat;
    }
    else {
      std::istream::seekg((long)this,_S_beg);
      HeaderList::riff(&local_60,(HeaderList *)file_size._M_state);
      ReadHeader<wave::RIFFHeader>(this,&local_60,&(this->header).riff);
      Header::~Header(&local_60);
      HeaderList::fmt(&local_a0,(HeaderList *)file_size._M_state);
      ReadHeader<wave::FMTHeader>(this,&local_a0,&(this->header).fmt);
      Header::~Header(&local_a0);
      HeaderList::data((Header *)&data_header.position_,(HeaderList *)file_size._M_state);
      ReadHeader<wave::DataHeader>(this,(Header *)&data_header.position_,&(this->header).data);
      Header::~Header((Header *)&data_header.position_);
      HeaderList::data((Header *)local_100,(HeaderList *)file_size._M_state);
      uVar4 = Header::position((Header *)local_100);
      Header::chunk_id_abi_cxx11_(&local_120,(Header *)local_100);
      lVar5 = std::__cxx11::string::size();
      this->data_offset_ = uVar4 + 4 + lVar5;
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,(char *)&this->header,4,&local_141);
      bVar2 = std::operator!=(&local_140,"RIFF");
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      if (bVar2) {
        this_local._4_4_ = kInvalidFormat;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_168,(this->header).riff.format,4,&local_169);
        bVar2 = std::operator!=(&local_168,"WAVE");
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator((allocator<char> *)&local_169);
        if (bVar2) {
          this_local._4_4_ = kInvalidFormat;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_190,(this->header).fmt.sub_chunk_1_id,4,&local_191);
          bVar2 = std::operator!=(&local_190,"fmt ");
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator((allocator<char> *)&local_191);
          if (bVar2) {
            this_local._4_4_ = kInvalidFormat;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_1b8,(this->header).data.sub_chunk_2_id,4,&local_1b9);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1b8,"data");
            std::__cxx11::string::~string((string *)local_1b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
            if (bVar2) {
              this_local._4_4_ = kInvalidFormat;
            }
            else {
              uVar1 = (this->header).fmt.bits_per_sample;
              if (((uVar1 == 8) || (uVar1 == 0x10)) || (uVar1 == 0x20)) {
                if ((this->header).fmt.audio_format == 1) {
                  this_local._4_4_ = kNoError;
                }
                else {
                  this_local._4_4_ = kInvalidFormat;
                }
              }
              else {
                this_local._4_4_ = kInvalidFormat;
              }
            }
          }
        }
      }
      local_148 = 1;
      Header::~Header((Header *)local_100);
    }
  }
  return this_local._4_4_;
}

Assistant:

Error ReadHeader(HeaderList* headers) {
    if (!istream.is_open()) {
      return kNotOpen;
    }
    istream.seekg(0, std::ios::end);
    auto file_size = istream.tellg();
    // If not enough data
    if (file_size < sizeof(WAVEHeader)) {
      return kInvalidFormat;
    }
    istream.seekg(0, std::ios::beg);
    
    // read headers
    ReadHeader(headers->riff(), &header.riff);
    ReadHeader(headers->fmt(), &header.fmt);
    ReadHeader(headers->data(), &header.data);
    // data offset is right after data header's ID and size
    auto data_header = headers->data();
    data_offset_ = data_header.position() + sizeof(data_header.chunk_size()) + (data_header.chunk_id().size() * sizeof(char));

    // check headers ids (make sure they are set)
    if (std::string(header.riff.chunk_id, 4) != "RIFF") {
      return kInvalidFormat;
    }
    if (std::string(header.riff.format, 4) != "WAVE") {
      return kInvalidFormat;
    }
    if (std::string(header.fmt.sub_chunk_1_id, 4) != "fmt ") {
      return kInvalidFormat;
    }
    if (std::string(header.data.sub_chunk_2_id, 4) != "data") {
      return kInvalidFormat;
    }

    // we only support 8 / 16 / 32  bit per sample
    auto bps = header.fmt.bits_per_sample;
    if (bps != 8 && bps != 16 && bps != 32) {
      return kInvalidFormat;
    }
    
    // And only support uncompressed PCM format
    if (header.fmt.audio_format != Format::WAVE_FORMAT_PCM) {
      return kInvalidFormat;
    }
    
    return kNoError;
  }